

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# names.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::java::(anonymous_namespace)::FieldName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,FieldDescriptor *field)

{
  bool bVar1;
  Descriptor *this_00;
  AlphaNum local_e0;
  string_view local_b0;
  allocator<char> local_99;
  string_view local_98;
  string local_88 [39];
  allocator<char> local_61;
  string_view local_60;
  string local_50 [55];
  undefined1 local_19;
  FieldDescriptor *local_18;
  FieldDescriptor *field_local;
  string *field_name;
  
  local_19 = 0;
  local_18 = (FieldDescriptor *)this;
  field_local = (FieldDescriptor *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  bVar1 = protobuf::internal::cpp::IsGroupLike(local_18);
  if (bVar1) {
    this_00 = FieldDescriptor::message_type(local_18);
    local_60 = Descriptor::name(this_00);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              (local_50,&local_60,&local_61);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,local_50);
    std::__cxx11::string::~string(local_50);
    std::allocator<char>::~allocator(&local_61);
  }
  else {
    local_98 = FieldDescriptor::name(local_18);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              (local_88,&local_98,&local_99);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,local_88);
    std::__cxx11::string::~string(local_88);
    std::allocator<char>::~allocator(&local_99);
  }
  local_b0 = (string_view)
             std::__cxx11::string::operator_cast_to_basic_string_view
                       ((string *)__return_storage_ptr__);
  bVar1 = java::anon_unknown_0::IsForbidden(local_b0);
  if (bVar1) {
    absl::lts_20250127::AlphaNum::AlphaNum(&local_e0,"#");
    absl::lts_20250127::StrAppend(__return_storage_ptr__,&local_e0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FieldName(const FieldDescriptor* field) {
  std::string field_name;
  // Groups are hacky:  The name of the field is just the lower-cased name
  // of the group type.  In Java, though, we would like to retain the original
  // capitalization of the type name.
  if (internal::cpp::IsGroupLike(*field)) {
    field_name = std::string(field->message_type()->name());
  } else {
    field_name = std::string(field->name());
  }
  if (IsForbidden(field_name)) {
    // Append a trailing "#" to indicate that the name should be decorated to
    // avoid collision with other names.
    absl::StrAppend(&field_name, "#");
  }
  return field_name;
}